

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::TransformFeedbackBufferStorageTestCase::initTestCaseGlobal
          (TransformFeedbackBufferStorageTestCase *this)

{
  GLuint GVar1;
  GLenum GVar2;
  bool bVar3;
  
  GVar1 = SparseBufferTestUtilities::createProgram
                    (this->m_gl,(char **)0x0,0,&initTestCaseGlobal::vs_body,1,(char **)0x0,
                     (uint *)0x0,0,initTestCaseGlobal::tf_varyings,2,0x8c8c);
  this->m_po_ia = GVar1;
  GVar1 = SparseBufferTestUtilities::createProgram
                    (this->m_gl,(char **)0x0,0,&initTestCaseGlobal::vs_body,1,(char **)0x0,
                     (uint *)0x0,0,initTestCaseGlobal::tf_varyings,2,0x8c8d);
  this->m_po_sa = GVar1;
  bVar3 = this->m_po_ia != 0;
  if (GVar1 != 0 && bVar3) {
    (*this->m_gl->genVertexArrays)(1,&this->m_vao);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1757);
    (*this->m_gl->bindVertexArray)(this->m_vao);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x175a);
    initDataBO(this);
  }
  return GVar1 != 0 && bVar3;
}

Assistant:

bool TransformFeedbackBufferStorageTestCase::initTestCaseGlobal()
{
	bool result = true;

	/* Initialize test program object */
	static const char*		  tf_varyings[] = { "instance_id", "vertex_id" };
	static const unsigned int n_tf_varyings = sizeof(tf_varyings) / sizeof(tf_varyings[0]);
	static const char*		  vs_body		= "#version 420 core\n"
								 "\n"
								 "out uint instance_id;\n"
								 "out uint vertex_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    instance_id = gl_InstanceID;\n"
								 "    vertex_id   = gl_VertexID;\n"
								 "}\n";

	m_po_ia = SparseBufferTestUtilities::createProgram(m_gl, DE_NULL, /* fs_body_parts */
													   0,			  /* n_fs_body_parts */
													   &vs_body, 1,   /* n_vs_body_parts */
													   DE_NULL,		  /* attribute_names */
													   DE_NULL,		  /* attribute_locations */
													   0,			  /* n_attribute_properties */
													   tf_varyings, n_tf_varyings, GL_INTERLEAVED_ATTRIBS);

	m_po_sa = SparseBufferTestUtilities::createProgram(m_gl, DE_NULL, /* fs_body_parts */
													   0,			  /* n_fs_body_parts */
													   &vs_body, 1,   /* n_vs_body_parts */
													   DE_NULL,		  /* attribute_names */
													   DE_NULL,		  /* attribute_locations */
													   0,			  /* n_attribute_properties */
													   tf_varyings, n_tf_varyings, GL_SEPARATE_ATTRIBS);

	if (m_po_ia == 0 || m_po_sa == 0)
	{
		result = false;

		goto end;
	}

	/* Generate & bind a VAO */
	m_gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenVertexArrays() call failed.");

	m_gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindVertexArray() call failed.");

	initDataBO();

end:
	return result;
}